

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomExternalWrapperObject.cpp
# Opt level: O2

BOOL __thiscall
Js::CustomExternalWrapperObject::SetItem
          (CustomExternalWrapperObject *this,uint32 index,Var value,PropertyOperationFlags flags)

{
  ImplicitCallFlags IVar1;
  ScriptContext *scriptContext;
  Type *pTVar2;
  JavascriptBoolean *pJVar3;
  code *pcVar4;
  bool bVar5;
  BOOL BVar6;
  Attributes attributes;
  int iVar7;
  JavascriptFunction *function;
  undefined4 *puVar8;
  Var pvVar9;
  RecyclableObject *ptr;
  ThreadContext *pTVar10;
  anon_class_56_7_b8deb65f local_88;
  Var local_50;
  uint32 local_44;
  ThreadContext *local_40;
  PropertyOperationFlags local_38;
  bool local_31;
  
  BVar6 = VerifyObjectAlive(this);
  if (BVar6 == 0) {
    return 0;
  }
  scriptContext =
       (((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
       super_JavascriptLibraryBase).scriptContext.ptr;
  ThreadContext::ProbeStack(scriptContext->threadContext,0xc00,scriptContext,(PVOID)0x0);
  local_40 = scriptContext->threadContext;
  BVar6 = EnsureInitialized(this,scriptContext);
  if (BVar6 == 0) goto LAB_00a10b14;
  pTVar2 = (this->super_DynamicObject).super_RecyclableObject.type.ptr;
  pvVar9 = *(Var *)&(pTVar2[1].propertyCache.ptr)->elements[0].field_0x8;
  if (pvVar9 == (Var)0x0) {
    value = CrossSite::MarshalVar
                      ((((pTVar2->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                       scriptContext.ptr,value,false);
    iVar7 = DynamicObject::SetItem(&this->super_DynamicObject,index,value,flags);
  }
  else {
    local_44 = index;
    local_38 = flags;
    function = VarTo<Js::JavascriptFunction>(pvVar9);
    bVar5 = ScriptContext::IsHeapEnumInProgress
                      ((((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->
                         javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr);
    if (bVar5) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar8 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CustomExternalWrapperObject.cpp"
                                  ,0x27a,"(!GetScriptContext()->IsHeapEnumInProgress())",
                                  "!GetScriptContext()->IsHeapEnumInProgress()");
      if (!bVar5) {
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar8 = 0;
    }
    pJVar3 = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
             super_JavascriptLibraryBase).booleanTrue.ptr;
    pvVar9 = JavascriptNumber::ToVar(local_44,scriptContext);
    pTVar10 = local_40;
    flags = local_38;
    index = local_44;
    if (function == (JavascriptFunction *)0x0) goto LAB_00a10b14;
    local_88.threadContext = local_40;
    local_88.propertyName = (Var)0x0;
    local_31 = local_40->reentrancySafeOrHandled;
    local_40->reentrancySafeOrHandled = true;
    local_88.setMethod = function;
    local_88.targetObj = (RecyclableObject *)this;
    local_88.isPropertyNameNumeric = pJVar3;
    local_88.propertyNameNumericValue = pvVar9;
    local_88.newValue = value;
    local_50 = value;
    attributes = FunctionInfo::GetAttributes((RecyclableObject *)function);
    bVar5 = ThreadContext::HasNoSideEffect(pTVar10,(RecyclableObject *)function,attributes);
    pTVar10 = local_40;
    if (bVar5) {
      ptr = (RecyclableObject *)anon_func::anon_class_56_7_b8deb65f::operator()(&local_88);
      bVar5 = ThreadContext::IsOnStack(ptr);
LAB_00a10a14:
      pTVar10 = local_40;
      if (bVar5 != false) {
        local_40->implicitCallFlags = local_40->implicitCallFlags | ImplicitCall_Accessor;
      }
    }
    else if ((local_40->disableImplicitFlags & DisableImplicitCallFlag) == DisableImplicitNoFlag) {
      if ((attributes & HasNoSideEffect) != None) {
        ptr = (RecyclableObject *)anon_func::anon_class_56_7_b8deb65f::operator()(&local_88);
        bVar5 = ThreadContext::IsOnStack(ptr);
        goto LAB_00a10a14;
      }
      IVar1 = local_40->implicitCallFlags;
      ptr = (RecyclableObject *)anon_func::anon_class_56_7_b8deb65f::operator()(&local_88);
      pTVar10->implicitCallFlags = IVar1 | ImplicitCall_Accessor;
    }
    else {
      local_40->implicitCallFlags = local_40->implicitCallFlags | ImplicitCall_Accessor;
      ptr = (((((((((function->super_DynamicObject).super_RecyclableObject.type.ptr)->
                  javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->
              super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
            undefinedValue.ptr;
    }
    flags = local_38;
    pTVar10->reentrancySafeOrHandled = local_31;
    iVar7 = JavascriptConversion::ToBoolean(ptr,scriptContext);
    value = local_50;
    index = local_44;
  }
  if (iVar7 != 0) {
    return 1;
  }
LAB_00a10b14:
  pvVar9 = CrossSite::MarshalVar
                     ((((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->
                        javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr,
                      value,false);
  BVar6 = DynamicObject::SetItem(&this->super_DynamicObject,index,pvVar9,flags);
  return BVar6;
}

Assistant:

BOOL CustomExternalWrapperObject::SetItem(uint32 index, Js::Var value, Js::PropertyOperationFlags flags)
{
    if (!this->VerifyObjectAlive()) return FALSE;

    auto getPropertyName = [&](Js::ScriptContext * requestContext, Js::Var * isPropertyNameNumeric, Js::Var * propertyNameNumericValue)->Js::Var
    {
        *isPropertyNameNumeric = requestContext->GetLibrary()->GetTrue();
        *propertyNameNumericValue = JavascriptNumber::ToVar(index, requestContext);
        return nullptr;
    };

    auto fn = [&]()->BOOL
    {
        // setting the value could be deferred and now we are on a different context from
        // make sure the value has the same context as the containing object.
        value = Js::CrossSite::MarshalVar(this->GetScriptContext(), value);
        return DynamicObject::SetItem(index, value, flags);
    };
    BOOL trapResult = SetPropertyTrap(this, CustomExternalWrapperObject::SetPropertyTrapKind::SetItemKind, getPropertyName, value, GetScriptContext(), flags, FALSE, fn, nullptr);
    if (!trapResult)
    {
        // setting the value could be deferred and now we are on a different context from
        // make sure the value has the same context as the containing object.
        value = Js::CrossSite::MarshalVar(this->GetScriptContext(), value);
        return Js::DynamicObject::SetItem(index, value, flags);
    }

    return TRUE;
}